

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

bool __thiscall flatbuffers::Parser::ParseJson(Parser *this,char *json,char *json_filename)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 in_RAX;
  byte bVar4;
  undefined1 auStack_38 [5];
  undefined1 local_33;
  byte local_32;
  
  iVar1 = this->parse_depth_counter_;
  _auStack_38 = in_RAX;
  FlatBufferBuilderImpl<false>::Clear(&this->builder_);
  StartParseFile((Parser *)(auStack_38 + 4),(char *)this,json);
  uVar2 = _auStack_38;
  _auStack_38 = CONCAT15(1,auStack_38);
  uVar3 = _auStack_38;
  auStack_38[4] = SUB81(uVar2,4);
  _auStack_38 = uVar3;
  if (auStack_38[4] == '\0') {
    DoParseJson((Parser *)(auStack_38 + 6));
    uVar2 = _auStack_38;
    _auStack_38 = CONCAT17(1,_auStack_38);
    uVar3 = _auStack_38;
    local_32 = SUB81(uVar2,6);
    bVar4 = local_32 ^ 1;
    _auStack_38 = uVar3;
    CheckedError::~CheckedError((CheckedError *)(auStack_38 + 6));
  }
  else {
    bVar4 = 0;
  }
  CheckedError::~CheckedError((CheckedError *)(auStack_38 + 4));
  if (iVar1 == this->parse_depth_counter_) {
    return (bool)bVar4;
  }
  __assert_fail("initial_depth == parse_depth_counter_",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                ,0xd9c,"bool flatbuffers::Parser::ParseJson(const char *, const char *)");
}

Assistant:

bool Parser::ParseJson(const char *json, const char *json_filename) {
  const auto initial_depth = parse_depth_counter_;
  (void)initial_depth;
  builder_.Clear();
  const auto done =
      !StartParseFile(json, json_filename).Check() && !DoParseJson().Check();
  FLATBUFFERS_ASSERT(initial_depth == parse_depth_counter_);
  return done;
}